

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  long lVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar99;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  float fVar112;
  float fVar117;
  float fVar118;
  undefined1 auVar113 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_dc0;
  ulong *local_db8;
  undefined1 local_cc0 [16];
  undefined1 (*local_cb0) [16];
  long local_ca8;
  long local_ca0;
  ulong local_c98;
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined4 local_bf0;
  undefined4 uStack_bec;
  undefined4 uStack_be8;
  undefined4 uStack_be4;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined4 local_bc0;
  undefined4 uStack_bbc;
  undefined4 uStack_bb8;
  undefined4 uStack_bb4;
  undefined1 local_bb0 [16];
  undefined4 local_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b98;
  undefined4 uStack_b94;
  undefined1 local_b90 [16];
  uint local_b80;
  uint uStack_b7c;
  uint uStack_b78;
  uint uStack_b74;
  uint uStack_b70;
  uint uStack_b6c;
  uint uStack_b68;
  uint uStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined4 uStack_b44;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_db8 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar110._4_4_ = uVar1;
  auVar110._0_4_ = uVar1;
  auVar110._8_4_ = uVar1;
  auVar110._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar113._4_4_ = uVar1;
  auVar113._0_4_ = uVar1;
  auVar113._8_4_ = uVar1;
  auVar113._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar36 = fVar2 * 0.99999964;
  fVar37 = fVar3 * 0.99999964;
  fVar38 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_c98 = uVar65 ^ 0x10;
  iVar5 = (tray->tnear).field_0.i[k];
  auVar88._4_4_ = iVar5;
  auVar88._0_4_ = iVar5;
  auVar88._8_4_ = iVar5;
  auVar88._12_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar94._4_4_ = iVar5;
  auVar94._0_4_ = iVar5;
  auVar94._8_4_ = iVar5;
  auVar94._12_4_ = iVar5;
  local_b40._16_16_ = mm_lookupmask_ps._240_16_;
  local_b40._0_16_ = mm_lookupmask_ps._0_16_;
  local_cb0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar85._8_4_ = 0x3f800000;
  auVar85._0_8_ = 0x3f8000003f800000;
  auVar85._12_4_ = 0x3f800000;
  auVar85._16_4_ = 0x3f800000;
  auVar85._20_4_ = 0x3f800000;
  auVar85._24_4_ = 0x3f800000;
  auVar85._28_4_ = 0x3f800000;
  auVar70._8_4_ = 0xbf800000;
  auVar70._0_8_ = 0xbf800000bf800000;
  auVar70._12_4_ = 0xbf800000;
  auVar70._16_4_ = 0xbf800000;
  auVar70._20_4_ = 0xbf800000;
  auVar70._24_4_ = 0xbf800000;
  auVar70._28_4_ = 0xbf800000;
  _local_b60 = vblendvps_avx(auVar85,auVar70,local_b40);
  do {
    if (local_db8 == &local_800) {
LAB_01592cfc:
      return local_db8 != &local_800;
    }
    local_dc0 = local_db8 + -1;
    uVar68 = local_db8[-1];
    while ((uVar68 & 8) == 0) {
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar65),auVar108);
      auVar69._0_4_ = fVar36 * auVar39._0_4_;
      auVar69._4_4_ = fVar36 * auVar39._4_4_;
      auVar69._8_4_ = fVar36 * auVar39._8_4_;
      auVar69._12_4_ = fVar36 * auVar39._12_4_;
      auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar67),auVar110);
      auVar73._0_4_ = fVar37 * auVar39._0_4_;
      auVar73._4_4_ = fVar37 * auVar39._4_4_;
      auVar73._8_4_ = fVar37 * auVar39._8_4_;
      auVar73._12_4_ = fVar37 * auVar39._12_4_;
      auVar39 = vmaxps_avx(auVar69,auVar73);
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar66),auVar113);
      auVar74._0_4_ = fVar38 * auVar69._0_4_;
      auVar74._4_4_ = fVar38 * auVar69._4_4_;
      auVar74._8_4_ = fVar38 * auVar69._8_4_;
      auVar74._12_4_ = fVar38 * auVar69._12_4_;
      auVar69 = vmaxps_avx(auVar74,auVar88);
      auVar39 = vmaxps_avx(auVar39,auVar69);
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + local_c98),auVar108);
      auVar75._0_4_ = fVar2 * auVar69._0_4_;
      auVar75._4_4_ = fVar2 * auVar69._4_4_;
      auVar75._8_4_ = fVar2 * auVar69._8_4_;
      auVar75._12_4_ = fVar2 * auVar69._12_4_;
      auVar69 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar67 ^ 0x10)),auVar110);
      auVar82._0_4_ = fVar3 * auVar69._0_4_;
      auVar82._4_4_ = fVar3 * auVar69._4_4_;
      auVar82._8_4_ = fVar3 * auVar69._8_4_;
      auVar82._12_4_ = fVar3 * auVar69._12_4_;
      auVar69 = vminps_avx(auVar75,auVar82);
      auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar66 ^ 0x10)),auVar113);
      auVar83._0_4_ = fVar4 * auVar73._0_4_;
      auVar83._4_4_ = fVar4 * auVar73._4_4_;
      auVar83._8_4_ = fVar4 * auVar73._8_4_;
      auVar83._12_4_ = fVar4 * auVar73._12_4_;
      auVar73 = vminps_avx(auVar83,auVar94);
      auVar69 = vminps_avx(auVar69,auVar73);
      auVar39 = vcmpps_avx(auVar39,auVar69,2);
      uVar61 = vmovmskps_avx(auVar39);
      if (uVar61 == 0) goto LAB_01592cd2;
      uVar61 = uVar61 & 0xff;
      uVar62 = uVar68 & 0xfffffffffffffff0;
      lVar43 = 0;
      for (uVar68 = (ulong)uVar61; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
        lVar43 = lVar43 + 1;
      }
      uVar68 = *(ulong *)(uVar62 + lVar43 * 8);
      uVar61 = uVar61 - 1 & uVar61;
      uVar64 = (ulong)uVar61;
      if (uVar61 != 0) {
        do {
          *local_dc0 = uVar68;
          local_dc0 = local_dc0 + 1;
          lVar43 = 0;
          for (uVar68 = uVar64; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
            lVar43 = lVar43 + 1;
          }
          uVar64 = uVar64 - 1 & uVar64;
          uVar68 = *(ulong *)(uVar62 + lVar43 * 8);
        } while (uVar64 != 0);
      }
    }
    local_ca0 = (ulong)((uint)uVar68 & 0xf) - 8;
    uVar68 = uVar68 & 0xfffffffffffffff0;
    for (local_ca8 = 0; local_ca8 != local_ca0; local_ca8 = local_ca8 + 1) {
      lVar63 = local_ca8 * 0x60;
      pSVar6 = context->scene;
      ppfVar7 = (pSVar6->vertices).items;
      pfVar8 = ppfVar7[*(uint *)(uVar68 + 0x40 + lVar63)];
      auVar86._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x20 + lVar63));
      auVar86._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + lVar63));
      pfVar9 = ppfVar7[*(uint *)(uVar68 + 0x48 + lVar63)];
      auVar89._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x28 + lVar63));
      auVar89._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 8 + lVar63));
      pfVar10 = ppfVar7[*(uint *)(uVar68 + 0x44 + lVar63)];
      auVar100._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x24 + lVar63));
      auVar100._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 4 + lVar63));
      pfVar11 = ppfVar7[*(uint *)(uVar68 + 0x4c + lVar63)];
      auVar114._16_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x2c + lVar63));
      auVar114._0_16_ = *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0xc + lVar63));
      lVar43 = uVar68 + 0x40 + lVar63;
      local_9e0 = *(undefined8 *)(lVar43 + 0x10);
      uStack_9d8 = *(undefined8 *)(lVar43 + 0x18);
      uStack_9d0 = local_9e0;
      uStack_9c8 = uStack_9d8;
      lVar43 = uVar68 + 0x50 + lVar63;
      local_a00 = *(undefined8 *)(lVar43 + 0x10);
      uStack_9f8 = *(undefined8 *)(lVar43 + 0x18);
      auVar73 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x10 + lVar63)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x18 + lVar63)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x10 + lVar63)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x18 + lVar63)));
      auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x14 + lVar63)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x1c + lVar63)));
      auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x14 + lVar63)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x1c + lVar63)));
      auVar75 = vunpcklps_avx(auVar39,auVar69);
      auVar82 = vunpcklps_avx(auVar73,auVar74);
      auVar39 = vunpckhps_avx(auVar73,auVar74);
      auVar74 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x30 + lVar63)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x38 + lVar63)));
      auVar69 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar68 + 0x30 + lVar63)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar68 + 0x38 + lVar63)));
      auVar83 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x34 + lVar63)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x3c + lVar63)));
      auVar73 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar68 + 0x34 + lVar63)),
                              *(undefined1 (*) [16])(pfVar11 + *(uint *)(uVar68 + 0x3c + lVar63)));
      auVar73 = vunpcklps_avx(auVar69,auVar73);
      auVar84 = vunpcklps_avx(auVar74,auVar83);
      auVar69 = vunpckhps_avx(auVar74,auVar83);
      uStack_9f0 = local_a00;
      uStack_9e8 = uStack_9f8;
      auVar70 = vunpcklps_avx(auVar100,auVar114);
      auVar85 = vunpcklps_avx(auVar86,auVar89);
      auVar111 = vunpcklps_avx(auVar85,auVar70);
      auVar70 = vunpckhps_avx(auVar85,auVar70);
      auVar85 = vunpckhps_avx(auVar100,auVar114);
      auVar81 = vunpckhps_avx(auVar86,auVar89);
      auVar85 = vunpcklps_avx(auVar81,auVar85);
      auVar90._16_16_ = auVar82;
      auVar90._0_16_ = auVar82;
      auVar101._16_16_ = auVar39;
      auVar101._0_16_ = auVar39;
      auVar77._16_16_ = auVar75;
      auVar77._0_16_ = auVar75;
      auVar129._16_16_ = auVar84;
      auVar129._0_16_ = auVar84;
      auVar95._16_16_ = auVar69;
      auVar95._0_16_ = auVar69;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar115._4_4_ = uVar1;
      auVar115._0_4_ = uVar1;
      auVar115._8_4_ = uVar1;
      auVar115._12_4_ = uVar1;
      auVar115._16_4_ = uVar1;
      auVar115._20_4_ = uVar1;
      auVar115._24_4_ = uVar1;
      auVar115._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar125._4_4_ = uVar1;
      auVar125._0_4_ = uVar1;
      auVar125._8_4_ = uVar1;
      auVar125._12_4_ = uVar1;
      auVar125._16_4_ = uVar1;
      auVar125._20_4_ = uVar1;
      auVar125._24_4_ = uVar1;
      auVar125._28_4_ = uVar1;
      auVar71._16_16_ = auVar73;
      auVar71._0_16_ = auVar73;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar127._4_4_ = uVar1;
      auVar127._0_4_ = uVar1;
      auVar127._8_4_ = uVar1;
      auVar127._12_4_ = uVar1;
      auVar127._16_4_ = uVar1;
      auVar127._20_4_ = uVar1;
      auVar127._24_4_ = uVar1;
      auVar127._28_4_ = uVar1;
      local_c40 = vsubps_avx(auVar111,auVar115);
      auVar111 = vsubps_avx(auVar70,auVar125);
      local_c60 = vsubps_avx(auVar85,auVar127);
      auVar70 = vsubps_avx(auVar90,auVar115);
      auVar85 = vsubps_avx(auVar101,auVar125);
      auVar81 = vsubps_avx(auVar77,auVar127);
      auVar77 = vsubps_avx(auVar129,auVar115);
      auVar86 = vsubps_avx(auVar95,auVar125);
      auVar40 = vsubps_avx(auVar71,auVar127);
      local_a20 = vsubps_avx(auVar77,local_c40);
      local_a60 = vsubps_avx(auVar86,auVar111);
      local_a40 = vsubps_avx(auVar40,local_c60);
      auVar72._0_4_ = local_c40._0_4_ + auVar77._0_4_;
      auVar72._4_4_ = local_c40._4_4_ + auVar77._4_4_;
      auVar72._8_4_ = local_c40._8_4_ + auVar77._8_4_;
      auVar72._12_4_ = local_c40._12_4_ + auVar77._12_4_;
      auVar72._16_4_ = local_c40._16_4_ + auVar77._16_4_;
      auVar72._20_4_ = local_c40._20_4_ + auVar77._20_4_;
      auVar72._24_4_ = local_c40._24_4_ + auVar77._24_4_;
      auVar72._28_4_ = local_c40._28_4_ + auVar77._28_4_;
      auVar87._0_4_ = auVar111._0_4_ + auVar86._0_4_;
      auVar87._4_4_ = auVar111._4_4_ + auVar86._4_4_;
      auVar87._8_4_ = auVar111._8_4_ + auVar86._8_4_;
      auVar87._12_4_ = auVar111._12_4_ + auVar86._12_4_;
      auVar87._16_4_ = auVar111._16_4_ + auVar86._16_4_;
      auVar87._20_4_ = auVar111._20_4_ + auVar86._20_4_;
      auVar87._24_4_ = auVar111._24_4_ + auVar86._24_4_;
      auVar87._28_4_ = auVar111._28_4_ + auVar86._28_4_;
      fVar14 = local_c60._0_4_;
      auVar96._0_4_ = auVar40._0_4_ + fVar14;
      fVar15 = local_c60._4_4_;
      auVar96._4_4_ = auVar40._4_4_ + fVar15;
      fVar16 = local_c60._8_4_;
      auVar96._8_4_ = auVar40._8_4_ + fVar16;
      fVar17 = local_c60._12_4_;
      auVar96._12_4_ = auVar40._12_4_ + fVar17;
      fVar18 = local_c60._16_4_;
      auVar96._16_4_ = auVar40._16_4_ + fVar18;
      fVar19 = local_c60._20_4_;
      auVar96._20_4_ = auVar40._20_4_ + fVar19;
      fVar20 = local_c60._24_4_;
      auVar96._24_4_ = auVar40._24_4_ + fVar20;
      fVar99 = local_c60._28_4_;
      auVar96._28_4_ = auVar40._28_4_ + fVar99;
      auVar41._4_4_ = local_a40._4_4_ * auVar87._4_4_;
      auVar41._0_4_ = local_a40._0_4_ * auVar87._0_4_;
      auVar41._8_4_ = local_a40._8_4_ * auVar87._8_4_;
      auVar41._12_4_ = local_a40._12_4_ * auVar87._12_4_;
      auVar41._16_4_ = local_a40._16_4_ * auVar87._16_4_;
      auVar41._20_4_ = local_a40._20_4_ * auVar87._20_4_;
      auVar41._24_4_ = local_a40._24_4_ * auVar87._24_4_;
      auVar41._28_4_ = uVar1;
      auVar69 = vfmsub231ps_fma(auVar41,local_a60,auVar96);
      auVar42._4_4_ = local_a20._4_4_ * auVar96._4_4_;
      auVar42._0_4_ = local_a20._0_4_ * auVar96._0_4_;
      auVar42._8_4_ = local_a20._8_4_ * auVar96._8_4_;
      auVar42._12_4_ = local_a20._12_4_ * auVar96._12_4_;
      auVar42._16_4_ = local_a20._16_4_ * auVar96._16_4_;
      auVar42._20_4_ = local_a20._20_4_ * auVar96._20_4_;
      auVar42._24_4_ = local_a20._24_4_ * auVar96._24_4_;
      auVar42._28_4_ = auVar96._28_4_;
      auVar39 = vfmsub231ps_fma(auVar42,local_a40,auVar72);
      auVar45._4_4_ = local_a60._4_4_ * auVar72._4_4_;
      auVar45._0_4_ = local_a60._0_4_ * auVar72._0_4_;
      auVar45._8_4_ = local_a60._8_4_ * auVar72._8_4_;
      auVar45._12_4_ = local_a60._12_4_ * auVar72._12_4_;
      auVar45._16_4_ = local_a60._16_4_ * auVar72._16_4_;
      auVar45._20_4_ = local_a60._20_4_ * auVar72._20_4_;
      auVar45._24_4_ = local_a60._24_4_ * auVar72._24_4_;
      auVar45._28_4_ = auVar72._28_4_;
      auVar73 = vfmsub231ps_fma(auVar45,local_a20,auVar87);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar126._4_4_ = uVar1;
      auVar126._0_4_ = uVar1;
      auVar126._8_4_ = uVar1;
      auVar126._12_4_ = uVar1;
      auVar126._16_4_ = uVar1;
      auVar126._20_4_ = uVar1;
      auVar126._24_4_ = uVar1;
      auVar126._28_4_ = uVar1;
      local_aa0 = *(float *)(ray + k * 4 + 0x60);
      auVar46._4_4_ = local_aa0 * auVar73._4_4_;
      auVar46._0_4_ = local_aa0 * auVar73._0_4_;
      auVar46._8_4_ = local_aa0 * auVar73._8_4_;
      auVar46._12_4_ = local_aa0 * auVar73._12_4_;
      auVar46._16_4_ = local_aa0 * 0.0;
      auVar46._20_4_ = local_aa0 * 0.0;
      auVar46._24_4_ = local_aa0 * 0.0;
      auVar46._28_4_ = auVar87._28_4_;
      auVar39 = vfmadd231ps_fma(auVar46,auVar126,ZEXT1632(auVar39));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_a80._4_4_ = uVar1;
      local_a80._0_4_ = uVar1;
      local_a80._8_4_ = uVar1;
      local_a80._12_4_ = uVar1;
      local_a80._16_4_ = uVar1;
      local_a80._20_4_ = uVar1;
      local_a80._24_4_ = uVar1;
      local_a80._28_4_ = uVar1;
      auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),local_a80,ZEXT1632(auVar69));
      local_ac0 = vsubps_avx(auVar111,auVar85);
      local_ae0 = vsubps_avx(local_c60,auVar81);
      auVar128._0_4_ = auVar111._0_4_ + auVar85._0_4_;
      auVar128._4_4_ = auVar111._4_4_ + auVar85._4_4_;
      auVar128._8_4_ = auVar111._8_4_ + auVar85._8_4_;
      auVar128._12_4_ = auVar111._12_4_ + auVar85._12_4_;
      auVar128._16_4_ = auVar111._16_4_ + auVar85._16_4_;
      auVar128._20_4_ = auVar111._20_4_ + auVar85._20_4_;
      auVar128._24_4_ = auVar111._24_4_ + auVar85._24_4_;
      auVar128._28_4_ = auVar111._28_4_ + auVar85._28_4_;
      auVar97._0_4_ = fVar14 + auVar81._0_4_;
      auVar97._4_4_ = fVar15 + auVar81._4_4_;
      auVar97._8_4_ = fVar16 + auVar81._8_4_;
      auVar97._12_4_ = fVar17 + auVar81._12_4_;
      auVar97._16_4_ = fVar18 + auVar81._16_4_;
      auVar97._20_4_ = fVar19 + auVar81._20_4_;
      auVar97._24_4_ = fVar20 + auVar81._24_4_;
      fVar112 = auVar81._28_4_;
      auVar97._28_4_ = fVar99 + fVar112;
      fVar103 = local_ae0._0_4_;
      fVar105 = local_ae0._4_4_;
      auVar47._4_4_ = auVar128._4_4_ * fVar105;
      auVar47._0_4_ = auVar128._0_4_ * fVar103;
      fVar21 = local_ae0._8_4_;
      auVar47._8_4_ = auVar128._8_4_ * fVar21;
      fVar24 = local_ae0._12_4_;
      auVar47._12_4_ = auVar128._12_4_ * fVar24;
      fVar27 = local_ae0._16_4_;
      auVar47._16_4_ = auVar128._16_4_ * fVar27;
      fVar30 = local_ae0._20_4_;
      auVar47._20_4_ = auVar128._20_4_ * fVar30;
      fVar33 = local_ae0._24_4_;
      auVar47._24_4_ = auVar128._24_4_ * fVar33;
      auVar47._28_4_ = fVar99;
      auVar73 = vfmsub231ps_fma(auVar47,local_ac0,auVar97);
      auVar41 = vsubps_avx(local_c40,auVar70);
      fVar99 = auVar41._0_4_;
      fVar106 = auVar41._4_4_;
      auVar48._4_4_ = auVar97._4_4_ * fVar106;
      auVar48._0_4_ = auVar97._0_4_ * fVar99;
      fVar22 = auVar41._8_4_;
      auVar48._8_4_ = auVar97._8_4_ * fVar22;
      fVar25 = auVar41._12_4_;
      auVar48._12_4_ = auVar97._12_4_ * fVar25;
      fVar28 = auVar41._16_4_;
      auVar48._16_4_ = auVar97._16_4_ * fVar28;
      fVar31 = auVar41._20_4_;
      auVar48._20_4_ = auVar97._20_4_ * fVar31;
      fVar34 = auVar41._24_4_;
      auVar48._24_4_ = auVar97._24_4_ * fVar34;
      auVar48._28_4_ = auVar97._28_4_;
      auVar123._0_4_ = local_c40._0_4_ + auVar70._0_4_;
      auVar123._4_4_ = local_c40._4_4_ + auVar70._4_4_;
      auVar123._8_4_ = local_c40._8_4_ + auVar70._8_4_;
      auVar123._12_4_ = local_c40._12_4_ + auVar70._12_4_;
      auVar123._16_4_ = local_c40._16_4_ + auVar70._16_4_;
      auVar123._20_4_ = local_c40._20_4_ + auVar70._20_4_;
      auVar123._24_4_ = local_c40._24_4_ + auVar70._24_4_;
      auVar123._28_4_ = local_c40._28_4_ + auVar70._28_4_;
      auVar69 = vfmsub231ps_fma(auVar48,local_ae0,auVar123);
      fVar104 = local_ac0._0_4_;
      fVar107 = local_ac0._4_4_;
      auVar49._4_4_ = auVar123._4_4_ * fVar107;
      auVar49._0_4_ = auVar123._0_4_ * fVar104;
      fVar23 = local_ac0._8_4_;
      auVar49._8_4_ = auVar123._8_4_ * fVar23;
      fVar26 = local_ac0._12_4_;
      auVar49._12_4_ = auVar123._12_4_ * fVar26;
      fVar29 = local_ac0._16_4_;
      auVar49._16_4_ = auVar123._16_4_ * fVar29;
      fVar32 = local_ac0._20_4_;
      auVar49._20_4_ = auVar123._20_4_ * fVar32;
      fVar35 = local_ac0._24_4_;
      auVar49._24_4_ = auVar123._24_4_ * fVar35;
      auVar49._28_4_ = local_ae0._28_4_;
      auVar74 = vfmsub231ps_fma(auVar49,auVar41,auVar128);
      auVar116._0_4_ = auVar74._0_4_ * local_aa0;
      auVar116._4_4_ = auVar74._4_4_ * local_aa0;
      auVar116._8_4_ = auVar74._8_4_ * local_aa0;
      auVar116._12_4_ = auVar74._12_4_ * local_aa0;
      auVar116._16_4_ = local_aa0 * 0.0;
      auVar116._20_4_ = local_aa0 * 0.0;
      auVar116._24_4_ = local_aa0 * 0.0;
      auVar116._28_4_ = 0;
      auVar69 = vfmadd231ps_fma(auVar116,auVar126,ZEXT1632(auVar69));
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_a80,ZEXT1632(auVar73));
      auVar42 = vsubps_avx(auVar70,auVar77);
      auVar91._0_4_ = auVar70._0_4_ + auVar77._0_4_;
      auVar91._4_4_ = auVar70._4_4_ + auVar77._4_4_;
      auVar91._8_4_ = auVar70._8_4_ + auVar77._8_4_;
      auVar91._12_4_ = auVar70._12_4_ + auVar77._12_4_;
      auVar91._16_4_ = auVar70._16_4_ + auVar77._16_4_;
      auVar91._20_4_ = auVar70._20_4_ + auVar77._20_4_;
      auVar91._24_4_ = auVar70._24_4_ + auVar77._24_4_;
      auVar91._28_4_ = auVar70._28_4_ + auVar77._28_4_;
      auVar77 = vsubps_avx(auVar85,auVar86);
      auVar102._0_4_ = auVar85._0_4_ + auVar86._0_4_;
      auVar102._4_4_ = auVar85._4_4_ + auVar86._4_4_;
      auVar102._8_4_ = auVar85._8_4_ + auVar86._8_4_;
      auVar102._12_4_ = auVar85._12_4_ + auVar86._12_4_;
      auVar102._16_4_ = auVar85._16_4_ + auVar86._16_4_;
      auVar102._20_4_ = auVar85._20_4_ + auVar86._20_4_;
      auVar102._24_4_ = auVar85._24_4_ + auVar86._24_4_;
      auVar102._28_4_ = auVar85._28_4_ + auVar86._28_4_;
      auVar86 = vsubps_avx(auVar81,auVar40);
      auVar78._0_4_ = auVar81._0_4_ + auVar40._0_4_;
      auVar78._4_4_ = auVar81._4_4_ + auVar40._4_4_;
      auVar78._8_4_ = auVar81._8_4_ + auVar40._8_4_;
      auVar78._12_4_ = auVar81._12_4_ + auVar40._12_4_;
      auVar78._16_4_ = auVar81._16_4_ + auVar40._16_4_;
      auVar78._20_4_ = auVar81._20_4_ + auVar40._20_4_;
      auVar78._24_4_ = auVar81._24_4_ + auVar40._24_4_;
      auVar78._28_4_ = fVar112 + auVar40._28_4_;
      auVar81._4_4_ = auVar86._4_4_ * auVar102._4_4_;
      auVar81._0_4_ = auVar86._0_4_ * auVar102._0_4_;
      auVar81._8_4_ = auVar86._8_4_ * auVar102._8_4_;
      auVar81._12_4_ = auVar86._12_4_ * auVar102._12_4_;
      auVar81._16_4_ = auVar86._16_4_ * auVar102._16_4_;
      auVar81._20_4_ = auVar86._20_4_ * auVar102._20_4_;
      auVar81._24_4_ = auVar86._24_4_ * auVar102._24_4_;
      auVar81._28_4_ = fVar112;
      auVar74 = vfmsub231ps_fma(auVar81,auVar77,auVar78);
      auVar40._4_4_ = auVar78._4_4_ * auVar42._4_4_;
      auVar40._0_4_ = auVar78._0_4_ * auVar42._0_4_;
      auVar40._8_4_ = auVar78._8_4_ * auVar42._8_4_;
      auVar40._12_4_ = auVar78._12_4_ * auVar42._12_4_;
      auVar40._16_4_ = auVar78._16_4_ * auVar42._16_4_;
      auVar40._20_4_ = auVar78._20_4_ * auVar42._20_4_;
      auVar40._24_4_ = auVar78._24_4_ * auVar42._24_4_;
      auVar40._28_4_ = auVar78._28_4_;
      auVar73 = vfmsub231ps_fma(auVar40,auVar86,auVar91);
      auVar50._4_4_ = auVar77._4_4_ * auVar91._4_4_;
      auVar50._0_4_ = auVar77._0_4_ * auVar91._0_4_;
      auVar50._8_4_ = auVar77._8_4_ * auVar91._8_4_;
      auVar50._12_4_ = auVar77._12_4_ * auVar91._12_4_;
      auVar50._16_4_ = auVar77._16_4_ * auVar91._16_4_;
      auVar50._20_4_ = auVar77._20_4_ * auVar91._20_4_;
      auVar50._24_4_ = auVar77._24_4_ * auVar91._24_4_;
      auVar50._28_4_ = auVar91._28_4_;
      auVar75 = vfmsub231ps_fma(auVar50,auVar42,auVar102);
      auVar92._0_4_ = local_aa0 * auVar75._0_4_;
      auVar92._4_4_ = local_aa0 * auVar75._4_4_;
      auVar92._8_4_ = local_aa0 * auVar75._8_4_;
      auVar92._12_4_ = local_aa0 * auVar75._12_4_;
      auVar92._16_4_ = local_aa0 * 0.0;
      auVar92._20_4_ = local_aa0 * 0.0;
      auVar92._24_4_ = local_aa0 * 0.0;
      auVar92._28_4_ = 0;
      auVar73 = vfmadd231ps_fma(auVar92,auVar126,ZEXT1632(auVar73));
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_a80,ZEXT1632(auVar74));
      local_9a0 = ZEXT1632(auVar69);
      local_9c0 = auVar39._0_4_;
      fStack_9bc = auVar39._4_4_;
      fStack_9b8 = auVar39._8_4_;
      fStack_9b4 = auVar39._12_4_;
      local_980 = ZEXT1632(CONCAT412(auVar73._12_4_ + auVar69._12_4_ + fStack_9b4,
                                     CONCAT48(auVar73._8_4_ + auVar69._8_4_ + fStack_9b8,
                                              CONCAT44(auVar73._4_4_ + auVar69._4_4_ + fStack_9bc,
                                                       auVar73._0_4_ + auVar69._0_4_ + local_9c0))))
      ;
      auVar79._8_4_ = 0x7fffffff;
      auVar79._0_8_ = 0x7fffffff7fffffff;
      auVar79._12_4_ = 0x7fffffff;
      auVar79._16_4_ = 0x7fffffff;
      auVar79._20_4_ = 0x7fffffff;
      auVar79._24_4_ = 0x7fffffff;
      auVar79._28_4_ = 0x7fffffff;
      auVar70 = vminps_avx(ZEXT1632(auVar39),local_9a0);
      auVar70 = vminps_avx(auVar70,ZEXT1632(auVar73));
      local_b20 = vandps_avx(local_980,auVar79);
      fVar112 = local_b20._0_4_ * 1.1920929e-07;
      fVar117 = local_b20._4_4_ * 1.1920929e-07;
      auVar51._4_4_ = fVar117;
      auVar51._0_4_ = fVar112;
      fVar118 = local_b20._8_4_ * 1.1920929e-07;
      auVar51._8_4_ = fVar118;
      fVar119 = local_b20._12_4_ * 1.1920929e-07;
      auVar51._12_4_ = fVar119;
      fVar120 = local_b20._16_4_ * 1.1920929e-07;
      auVar51._16_4_ = fVar120;
      fVar121 = local_b20._20_4_ * 1.1920929e-07;
      auVar51._20_4_ = fVar121;
      fVar122 = local_b20._24_4_ * 1.1920929e-07;
      auVar51._24_4_ = fVar122;
      auVar51._28_4_ = 0x34000000;
      auVar109._0_8_ = CONCAT44(fVar117,fVar112) ^ 0x8000000080000000;
      auVar109._8_4_ = -fVar118;
      auVar109._12_4_ = -fVar119;
      auVar109._16_4_ = -fVar120;
      auVar109._20_4_ = -fVar121;
      auVar109._24_4_ = -fVar122;
      auVar109._28_4_ = 0xb4000000;
      auVar70 = vcmpps_avx(auVar70,auVar109,5);
      local_b00 = ZEXT1632(auVar39);
      auVar81 = vmaxps_avx(local_b00,local_9a0);
      auVar85 = vmaxps_avx(auVar81,ZEXT1632(auVar73));
      auVar85 = vcmpps_avx(auVar85,auVar51,2);
      auVar85 = vorps_avx(auVar70,auVar85);
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0x7f,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0xbf,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar85[0x1f] < '\0') {
        auVar52._4_4_ = fVar107 * local_a40._4_4_;
        auVar52._0_4_ = fVar104 * local_a40._0_4_;
        auVar52._8_4_ = fVar23 * local_a40._8_4_;
        auVar52._12_4_ = fVar26 * local_a40._12_4_;
        auVar52._16_4_ = fVar29 * local_a40._16_4_;
        auVar52._20_4_ = fVar32 * local_a40._20_4_;
        auVar52._24_4_ = fVar35 * local_a40._24_4_;
        auVar52._28_4_ = auVar70._28_4_;
        auVar53._4_4_ = local_a60._4_4_ * fVar106;
        auVar53._0_4_ = local_a60._0_4_ * fVar99;
        auVar53._8_4_ = local_a60._8_4_ * fVar22;
        auVar53._12_4_ = local_a60._12_4_ * fVar25;
        auVar53._16_4_ = local_a60._16_4_ * fVar28;
        auVar53._20_4_ = local_a60._20_4_ * fVar31;
        auVar53._24_4_ = local_a60._24_4_ * fVar34;
        auVar53._28_4_ = 0x34000000;
        auVar39 = vfmsub213ps_fma(local_a60,local_ae0,auVar52);
        auVar54._4_4_ = auVar77._4_4_ * fVar105;
        auVar54._0_4_ = auVar77._0_4_ * fVar103;
        auVar54._8_4_ = auVar77._8_4_ * fVar21;
        auVar54._12_4_ = auVar77._12_4_ * fVar24;
        auVar54._16_4_ = auVar77._16_4_ * fVar27;
        auVar54._20_4_ = auVar77._20_4_ * fVar30;
        auVar54._24_4_ = auVar77._24_4_ * fVar33;
        auVar54._28_4_ = auVar81._28_4_;
        auVar55._4_4_ = auVar86._4_4_ * fVar106;
        auVar55._0_4_ = auVar86._0_4_ * fVar99;
        auVar55._8_4_ = auVar86._8_4_ * fVar22;
        auVar55._12_4_ = auVar86._12_4_ * fVar25;
        auVar55._16_4_ = auVar86._16_4_ * fVar28;
        auVar55._20_4_ = auVar86._20_4_ * fVar31;
        auVar55._24_4_ = auVar86._24_4_ * fVar34;
        auVar55._28_4_ = local_b20._28_4_;
        auVar73 = vfmsub213ps_fma(auVar86,local_ac0,auVar54);
        auVar70 = vandps_avx(auVar52,auVar79);
        auVar81 = vandps_avx(auVar54,auVar79);
        auVar70 = vcmpps_avx(auVar70,auVar81,1);
        local_960 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar39),auVar70);
        auVar56._4_4_ = fVar107 * auVar42._4_4_;
        auVar56._0_4_ = fVar104 * auVar42._0_4_;
        auVar56._8_4_ = fVar23 * auVar42._8_4_;
        auVar56._12_4_ = fVar26 * auVar42._12_4_;
        auVar56._16_4_ = fVar29 * auVar42._16_4_;
        auVar56._20_4_ = fVar32 * auVar42._20_4_;
        auVar56._24_4_ = fVar35 * auVar42._24_4_;
        auVar56._28_4_ = auVar70._28_4_;
        auVar39 = vfmsub213ps_fma(auVar42,local_ae0,auVar55);
        auVar57._4_4_ = local_a20._4_4_ * fVar105;
        auVar57._0_4_ = local_a20._0_4_ * fVar103;
        auVar57._8_4_ = local_a20._8_4_ * fVar21;
        auVar57._12_4_ = local_a20._12_4_ * fVar24;
        auVar57._16_4_ = local_a20._16_4_ * fVar27;
        auVar57._20_4_ = local_a20._20_4_ * fVar30;
        auVar57._24_4_ = local_a20._24_4_ * fVar33;
        auVar57._28_4_ = auVar81._28_4_;
        auVar73 = vfmsub213ps_fma(local_a40,auVar41,auVar57);
        auVar70 = vandps_avx(auVar57,auVar79);
        auVar81 = vandps_avx(auVar55,auVar79);
        auVar70 = vcmpps_avx(auVar70,auVar81,1);
        local_940 = vblendvps_avx(ZEXT1632(auVar39),ZEXT1632(auVar73),auVar70);
        auVar39 = vfmsub213ps_fma(local_a20,local_ac0,auVar53);
        auVar73 = vfmsub213ps_fma(auVar77,auVar41,auVar56);
        auVar70 = vandps_avx(auVar53,auVar79);
        auVar81 = vandps_avx(auVar56,auVar79);
        auVar70 = vcmpps_avx(auVar70,auVar81,1);
        local_920 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar39),auVar70);
        auVar39 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        fVar99 = local_920._0_4_;
        auVar80._0_4_ = fVar99 * local_aa0;
        fVar112 = local_920._4_4_;
        auVar80._4_4_ = fVar112 * local_aa0;
        fVar103 = local_920._8_4_;
        auVar80._8_4_ = fVar103 * local_aa0;
        fVar104 = local_920._12_4_;
        auVar80._12_4_ = fVar104 * local_aa0;
        fVar105 = local_920._16_4_;
        auVar80._16_4_ = fVar105 * local_aa0;
        fVar106 = local_920._20_4_;
        auVar80._20_4_ = fVar106 * local_aa0;
        fVar107 = local_920._24_4_;
        auVar80._24_4_ = fVar107 * local_aa0;
        auVar80._28_4_ = 0;
        auVar73 = vfmadd213ps_fma(auVar126,local_940,auVar80);
        auVar73 = vfmadd213ps_fma(local_a80,local_960,ZEXT1632(auVar73));
        auVar81 = ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                     CONCAT48(auVar73._8_4_ + auVar73._8_4_,
                                              CONCAT44(auVar73._4_4_ + auVar73._4_4_,
                                                       auVar73._0_4_ + auVar73._0_4_))));
        auVar58._4_4_ = fVar112 * fVar15;
        auVar58._0_4_ = fVar99 * fVar14;
        auVar58._8_4_ = fVar103 * fVar16;
        auVar58._12_4_ = fVar104 * fVar17;
        auVar58._16_4_ = fVar105 * fVar18;
        auVar58._20_4_ = fVar106 * fVar19;
        auVar58._24_4_ = fVar107 * fVar20;
        auVar58._28_4_ = auVar85._28_4_;
        auVar73 = vfmadd213ps_fma(auVar111,local_940,auVar58);
        auVar74 = vfmadd213ps_fma(local_c40,local_960,ZEXT1632(auVar73));
        auVar70 = vrcpps_avx(auVar81);
        auVar124._8_4_ = 0x3f800000;
        auVar124._0_8_ = 0x3f8000003f800000;
        auVar124._12_4_ = 0x3f800000;
        auVar124._16_4_ = 0x3f800000;
        auVar124._20_4_ = 0x3f800000;
        auVar124._24_4_ = 0x3f800000;
        auVar124._28_4_ = 0x3f800000;
        auVar73 = vfnmadd213ps_fma(auVar70,auVar81,auVar124);
        auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar70,auVar70);
        local_8a0 = ZEXT1632(CONCAT412(auVar73._12_4_ * (auVar74._12_4_ + auVar74._12_4_),
                                       CONCAT48(auVar73._8_4_ * (auVar74._8_4_ + auVar74._8_4_),
                                                CONCAT44(auVar73._4_4_ *
                                                         (auVar74._4_4_ + auVar74._4_4_),
                                                         auVar73._0_4_ *
                                                         (auVar74._0_4_ + auVar74._0_4_)))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar111._4_4_ = uVar1;
        auVar111._0_4_ = uVar1;
        auVar111._8_4_ = uVar1;
        auVar111._12_4_ = uVar1;
        auVar111._16_4_ = uVar1;
        auVar111._20_4_ = uVar1;
        auVar111._24_4_ = uVar1;
        auVar111._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_c20._4_4_ = uVar1;
        local_c20._0_4_ = uVar1;
        local_c20._8_4_ = uVar1;
        local_c20._12_4_ = uVar1;
        local_c20._16_4_ = uVar1;
        local_c20._20_4_ = uVar1;
        local_c20._24_4_ = uVar1;
        local_c20._28_4_ = uVar1;
        auVar70 = vcmpps_avx(auVar111,local_8a0,2);
        auVar85 = vcmpps_avx(local_8a0,local_c20,2);
        auVar70 = vandps_avx(auVar70,auVar85);
        auVar73 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
        auVar39 = vpand_avx(auVar73,auVar39);
        auVar70 = vpmovsxwd_avx2(auVar39);
        if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar70 >> 0x7f,0) != '\0') ||
              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0xbf,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar70[0x1f] < '\0') {
          auVar70 = vcmpps_avx(auVar81,_DAT_01f7b000,4);
          auVar73 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
          auVar39 = vpand_avx(auVar39,auVar73);
          local_900 = vpmovsxwd_avx2(auVar39);
          if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_900 >> 0x7f,0) != '\0') ||
                (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_900 >> 0xbf,0) != '\0') ||
              (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_900[0x1f] < '\0') {
            uStack_9b0 = 0;
            uStack_9ac = 0;
            uStack_9a8 = 0;
            uStack_9a4 = 0;
            local_820 = local_b40;
            auVar70 = vrcpps_avx(local_980);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar98._16_4_ = 0x3f800000;
            auVar98._20_4_ = 0x3f800000;
            auVar98._24_4_ = 0x3f800000;
            auVar98._28_4_ = 0x3f800000;
            auVar73 = vfnmadd213ps_fma(local_980,auVar70,auVar98);
            auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar70,auVar70);
            auVar93._8_4_ = 0x219392ef;
            auVar93._0_8_ = 0x219392ef219392ef;
            auVar93._12_4_ = 0x219392ef;
            auVar93._16_4_ = 0x219392ef;
            auVar93._20_4_ = 0x219392ef;
            auVar93._24_4_ = 0x219392ef;
            auVar93._28_4_ = 0x219392ef;
            auVar70 = vcmpps_avx(local_b20,auVar93,5);
            auVar70 = vandps_avx(auVar70,ZEXT1632(auVar73));
            auVar59._4_4_ = fStack_9bc * auVar70._4_4_;
            auVar59._0_4_ = local_9c0 * auVar70._0_4_;
            auVar59._8_4_ = fStack_9b8 * auVar70._8_4_;
            auVar59._12_4_ = fStack_9b4 * auVar70._12_4_;
            auVar59._16_4_ = auVar70._16_4_ * 0.0;
            auVar59._20_4_ = auVar70._20_4_ * 0.0;
            auVar59._24_4_ = auVar70._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar85 = vminps_avx(auVar59,auVar98);
            auVar60._4_4_ = auVar69._4_4_ * auVar70._4_4_;
            auVar60._0_4_ = auVar69._0_4_ * auVar70._0_4_;
            auVar60._8_4_ = auVar69._8_4_ * auVar70._8_4_;
            auVar60._12_4_ = auVar69._12_4_ * auVar70._12_4_;
            auVar60._16_4_ = auVar70._16_4_ * 0.0;
            auVar60._20_4_ = auVar70._20_4_ * 0.0;
            auVar60._24_4_ = auVar70._24_4_ * 0.0;
            auVar60._28_4_ = auVar41._28_4_;
            auVar70 = vminps_avx(auVar60,auVar98);
            auVar81 = vsubps_avx(auVar98,auVar85);
            auVar111 = vsubps_avx(auVar98,auVar70);
            local_8c0 = vblendvps_avx(auVar70,auVar81,local_b40);
            local_8e0 = vblendvps_avx(auVar85,auVar111,local_b40);
            local_860._4_4_ = (float)local_b60._4_4_ * local_940._4_4_;
            local_860._0_4_ = (float)local_b60._0_4_ * local_940._0_4_;
            local_860._8_4_ = fStack_b58 * local_940._8_4_;
            local_860._12_4_ = fStack_b54 * local_940._12_4_;
            local_860._16_4_ = fStack_b50 * local_940._16_4_;
            local_860._20_4_ = fStack_b4c * local_940._20_4_;
            local_860._24_4_ = fStack_b48 * local_940._24_4_;
            local_860._28_4_ = local_8c0._28_4_;
            local_880[0] = local_960._0_4_ * (float)local_b60._0_4_;
            local_880[1] = local_960._4_4_ * (float)local_b60._4_4_;
            local_880[2] = local_960._8_4_ * fStack_b58;
            local_880[3] = local_960._12_4_ * fStack_b54;
            fStack_870 = local_960._16_4_ * fStack_b50;
            fStack_86c = local_960._20_4_ * fStack_b4c;
            fStack_868 = local_960._24_4_ * fStack_b48;
            uStack_864 = local_8e0._28_4_;
            local_840[0] = (float)local_b60._0_4_ * fVar99;
            local_840[1] = (float)local_b60._4_4_ * fVar112;
            local_840[2] = fStack_b58 * fVar103;
            local_840[3] = fStack_b54 * fVar104;
            fStack_830 = fStack_b50 * fVar105;
            fStack_82c = fStack_b4c * fVar106;
            fStack_828 = fStack_b48 * fVar107;
            uStack_824 = uStack_b44;
            auVar39 = vpacksswb_avx(auVar39,auVar39);
            uVar62 = (ulong)(byte)(SUB161(auVar39 >> 7,0) & 1 | (SUB161(auVar39 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar39 >> 0x3f,0) << 7);
            fStack_a9c = local_aa0;
            fStack_a98 = local_aa0;
            fStack_a94 = local_aa0;
            fStack_a90 = local_aa0;
            fStack_a8c = local_aa0;
            fStack_a88 = local_aa0;
            fStack_a84 = local_aa0;
            do {
              uVar64 = 0;
              for (uVar44 = uVar62; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                uVar64 = uVar64 + 1;
              }
              uVar61 = *(uint *)((long)&local_9e0 + uVar64 * 4);
              pGVar12 = (pSVar6->geometries).items[uVar61].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                local_c40._0_8_ = uVar64;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_c60._0_8_ = uVar62;
                  uVar62 = (ulong)(uint)((int)uVar64 * 4);
                  local_bc0 = *(undefined4 *)(local_8e0 + uVar62);
                  uVar1 = *(undefined4 *)(local_8c0 + uVar62);
                  local_bb0._4_4_ = uVar1;
                  local_bb0._0_4_ = uVar1;
                  local_bb0._8_4_ = uVar1;
                  local_bb0._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar62);
                  local_c90.context = context->user;
                  local_b90._4_4_ = uVar61;
                  local_b90._0_4_ = uVar61;
                  local_b90._8_4_ = uVar61;
                  local_b90._12_4_ = uVar61;
                  local_ba0 = *(undefined4 *)((long)&local_a00 + uVar62);
                  local_bf0 = *(undefined4 *)((long)local_880 + uVar62);
                  uVar1 = *(undefined4 *)(local_860 + uVar62);
                  local_be0._4_4_ = uVar1;
                  local_be0._0_4_ = uVar1;
                  local_be0._8_4_ = uVar1;
                  local_be0._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)((long)local_840 + uVar62);
                  local_bd0._4_4_ = uVar1;
                  local_bd0._0_4_ = uVar1;
                  local_bd0._8_4_ = uVar1;
                  local_bd0._12_4_ = uVar1;
                  vpcmpeqd_avx2(ZEXT1632(local_b90),ZEXT1632(local_b90));
                  uStack_b7c = (local_c90.context)->instID[0];
                  local_b80 = uStack_b7c;
                  uStack_b78 = uStack_b7c;
                  uStack_b74 = uStack_b7c;
                  uStack_b70 = (local_c90.context)->instPrimID[0];
                  uStack_b6c = uStack_b70;
                  uStack_b68 = uStack_b70;
                  uStack_b64 = uStack_b70;
                  local_cc0 = *local_cb0;
                  local_c90.valid = (int *)local_cc0;
                  local_c90.geometryUserPtr = pGVar12->userPtr;
                  local_c90.hit = (RTCHitN *)&local_bf0;
                  local_c90.N = 4;
                  local_c90.ray = (RTCRayN *)ray;
                  uStack_bec = local_bf0;
                  uStack_be8 = local_bf0;
                  uStack_be4 = local_bf0;
                  uStack_bbc = local_bc0;
                  uStack_bb8 = local_bc0;
                  uStack_bb4 = local_bc0;
                  uStack_b9c = local_ba0;
                  uStack_b98 = local_ba0;
                  uStack_b94 = local_ba0;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_c90);
                  }
                  if (local_cc0 == (undefined1  [16])0x0) {
                    auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar39 = auVar39 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_c90);
                    }
                    auVar69 = vpcmpeqd_avx(local_cc0,_DAT_01f45a50);
                    auVar39 = auVar69 ^ _DAT_01f46b70;
                    auVar84._8_4_ = 0xff800000;
                    auVar84._0_8_ = 0xff800000ff800000;
                    auVar84._12_4_ = 0xff800000;
                    auVar69 = vblendvps_avx(auVar84,*(undefined1 (*) [16])(local_c90.ray + 0x80),
                                            auVar69);
                    *(undefined1 (*) [16])(local_c90.ray + 0x80) = auVar69;
                  }
                  auVar76._8_8_ = 0x100000001;
                  auVar76._0_8_ = 0x100000001;
                  if ((auVar76 & auVar39) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_c20._0_4_;
                    uVar62 = local_c60._0_8_ ^ 1L << (local_c40._0_8_ & 0x3f);
                    goto LAB_01592bf9;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01592cfc;
              }
              uVar62 = uVar62 ^ 1L << (uVar64 & 0x3f);
LAB_01592bf9:
            } while (uVar62 != 0);
          }
        }
      }
    }
LAB_01592cd2:
    local_db8 = local_dc0;
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }